

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNAdaptController SUNAdaptController_Soderlind(SUNContext_conflict sunctx)

{
  SUNAdaptController C_00;
  SUNAdaptController C_01;
  undefined8 in_RDI;
  SUNAdaptControllerContent_Soderlind content;
  SUNAdaptController C;
  SUNContext_conflict sunctx_local_scope_;
  
  C_00 = (SUNAdaptController)SUNAdaptController_NewEmpty(in_RDI);
  C_00->ops->gettype = SUNAdaptController_GetType_Soderlind;
  C_00->ops->estimatestep = SUNAdaptController_EstimateStep_Soderlind;
  C_00->ops->reset = SUNAdaptController_Reset_Soderlind;
  C_00->ops->setdefaults = SUNAdaptController_SetDefaults_Soderlind;
  C_00->ops->write = SUNAdaptController_Write_Soderlind;
  C_00->ops->seterrorbias = SUNAdaptController_SetErrorBias_Soderlind;
  C_00->ops->updateh = SUNAdaptController_UpdateH_Soderlind;
  C_00->ops->space = SUNAdaptController_Space_Soderlind;
  C_01 = (SUNAdaptController)malloc(0x58);
  C_00->content = C_01;
  SUNAdaptController_SetDefaults_Soderlind(C_01);
  SUNAdaptController_Reset_Soderlind(C_00);
  return C_00;
}

Assistant:

SUNAdaptController SUNAdaptController_Soderlind(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  /* Create an empty controller object */
  SUNAdaptController C = SUNAdaptController_NewEmpty(sunctx);
  SUNCheckLastErrNull();
  SUNAdaptControllerContent_Soderlind content = NULL;

  /* Attach operations */
  C->ops->gettype      = SUNAdaptController_GetType_Soderlind;
  C->ops->estimatestep = SUNAdaptController_EstimateStep_Soderlind;
  C->ops->reset        = SUNAdaptController_Reset_Soderlind;
  C->ops->setdefaults  = SUNAdaptController_SetDefaults_Soderlind;
  C->ops->write        = SUNAdaptController_Write_Soderlind;
  C->ops->seterrorbias = SUNAdaptController_SetErrorBias_Soderlind;
  C->ops->updateh      = SUNAdaptController_UpdateH_Soderlind;
  C->ops->space        = SUNAdaptController_Space_Soderlind;

  /* Create content */
  content = (SUNAdaptControllerContent_Soderlind)malloc(sizeof(*content));
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);
  C->content = content;

  /* Fill content with default/reset values */
  SUNCheckCallNull(SUNAdaptController_SetDefaults_Soderlind(C));
  SUNCheckCallNull(SUNAdaptController_Reset_Soderlind(C));

  return (C);
}